

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Write<int> __thiscall
Omega_h::multiply_each<int>(Omega_h *this,Read<int> *a,Read<int> *b,string *name)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  ulong uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  Write<int> WVar7;
  type f;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar6 = pAVar1->size;
  }
  else {
    sVar6 = (ulong)pAVar1 >> 3;
  }
  Write<int>::Write((Write<int> *)this,(LO)(sVar6 >> 2),name);
  pAVar1 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if ((uVar3 & 0x3fffffffc) == 0) {
    if (((ulong)pAVar2 & 1) == 0) {
      sVar6 = pAVar2->size;
    }
    else {
      sVar6 = (ulong)pAVar2 >> 3;
    }
    pvVar4 = extraout_RDX;
    if ((sVar6 & 0x3fffffffc) != 0) {
      fail("assertion %s failed at %s +%d\n","a.size() == 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
           ,0x6b);
    }
  }
  else {
    if (((ulong)pAVar2 & 1) == 0) {
      sVar6 = pAVar2->size;
    }
    else {
      sVar6 = (ulong)pAVar2 >> 3;
    }
    if (((ulong)pAVar1 & 1) == 0) {
      sVar5 = pAVar1->size;
    }
    else {
      sVar5 = (ulong)pAVar1 >> 3;
    }
    f.width = divide_no_remainder<int>((int)(sVar6 >> 2),(int)(sVar5 >> 2));
    Write<int>::Write((Write<int> *)&f.c,(Write<int> *)this);
    Write<int>::Write((Write<int> *)&f.a,&a->write_);
    Write<int>::Write((Write<int> *)&f.b,&b->write_);
    pAVar1 = (b->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      sVar6 = pAVar1->size;
    }
    else {
      sVar6 = (ulong)pAVar1 >> 3;
    }
    parallel_for<Omega_h::multiply_each<int>(Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::_lambda(int)_1_>
              ((LO)(sVar6 >> 2),&f,"multiply_each");
    multiply_each<int>(Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::
    {lambda(int)#1}::~basic_string((_lambda_int__1_ *)&f);
    pvVar4 = extraout_RDX_00;
  }
  WVar7.shared_alloc_.direct_ptr = pvVar4;
  WVar7.shared_alloc_.alloc = (Alloc *)this;
  return (Write<int>)WVar7.shared_alloc_;
}

Assistant:

Write<T> multiply_each(Read<T> a, Read<T> b, std::string const& name) {
  Write<T> c(a.size(), name);
  if (b.size() == 0) {
    OMEGA_H_CHECK(a.size() == 0);
    return c;
  }
  auto width = divide_no_remainder(a.size(), b.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    for (Int j = 0; j < width; ++j) {
      c[i * width + j] = a[i * width + j] * b[i];
    }
  };
  parallel_for(b.size(), f, "multiply_each");
  return c;
}